

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O1

void benchmark<short>(tasks_t tasks,size_t max,size_t iters)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  size_t iters_00;
  short max_00;
  result_t rVar5;
  vector<short,_std::allocator<short>_> dividers;
  char local_61;
  double local_60;
  double local_58;
  double local_50;
  vector<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
  local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----- ",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"s16",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," -----",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  uVar2 = 0x7fff;
  if (max < 0x7fff) {
    uVar2 = max;
  }
  uVar1 = 0;
  iters_00 = (max / uVar2) * iters;
  local_58 = 0.0;
  local_50 = 0.0;
  max_00 = (short)uVar2;
  if ((tasks & 0x40) != 0) {
    get_primes<short,short>((vector<short,_std::allocator<short>_> *)&local_48,max_00);
    rVar5 = benchmark_sum_dividers<short,std::vector<short,std::allocator<short>>>
                      ((vector<short,_std::allocator<short>_> *)&local_48,iters_00);
    uVar1 = rVar5.sum;
    local_50 = rVar5.duration;
    local_61 = '.';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
    std::ostream::flush();
    if (local_48.
        super__Vector_base<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((tasks >> 8 & 1) == 0) {
    uVar2 = 0;
  }
  else {
    get_primes<libdivide::divider<short,(libdivide::Branching)0>,short>(&local_48,max_00);
    rVar5 = benchmark_sum_dividers<short,std::vector<libdivide::divider<short,(libdivide::Branching)0>,std::allocator<libdivide::divider<short,(libdivide::Branching)0>>>>
                      (&local_48,iters_00);
    uVar2 = rVar5.sum;
    local_58 = rVar5.duration;
    local_61 = '.';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
    std::ostream::flush();
    if (local_48.
        super__Vector_base<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)tasks < '\0') {
    get_primes<libdivide::divider<short,(libdivide::Branching)1>,short>
              ((vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                *)&local_48,max_00);
    rVar5 = benchmark_sum_dividers<short,std::vector<libdivide::divider<short,(libdivide::Branching)1>,std::allocator<libdivide::divider<short,(libdivide::Branching)1>>>>
                      ((vector<libdivide::divider<short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)1>_>_>
                        *)&local_48,iters_00);
    uVar3 = rVar5.sum;
    local_60 = rVar5.duration;
    local_61 = '.';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_48.
        super__Vector_base<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<libdivide::divider<short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<short,_(libdivide::Branching)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    local_60 = 0.0;
    uVar3 = 0;
  }
  if (((~tasks & 0x140) == 0) && (uVar2 != uVar1)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: branchfull_divider<");
    poVar4 = std::operator<<(poVar4,"s16");
    poVar4 = std::operator<<(poVar4,"> sum: ");
  }
  else {
    if (((~tasks & 0xc0) != 0) || (uVar3 == uVar1)) {
      if ((tasks & 0x40) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    system: ",0xc)
        ;
        poVar4 = std::ostream::_M_insert<double>(local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      if ((tasks >> 8 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"branchfull: ",0xc)
        ;
        poVar4 = std::ostream::_M_insert<double>(local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      if ((char)tasks < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"branchfree: ",0xc)
        ;
        poVar4 = std::ostream::_M_insert<double>(local_60);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      return;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: branchfree_divider<");
    poVar4 = std::operator<<(poVar4,"s16");
    poVar4 = std::operator<<(poVar4,"> sum: ");
    uVar2 = uVar3;
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<(poVar4,", but system sum: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

void benchmark(tasks_t tasks, size_t max, size_t iters) {
    std::cout << "----- " << type_tag<T>::get_tag() << " -----" << std::endl;

    bool test_system = !!(tasks & TEST_SYSTEM);
    bool test_branchfull = !!(tasks & TEST_BRANCHFULL);
    bool test_branchfree = !!(tasks & TEST_BRANCHFREE);

    result_t sys = {0, 0};
    result_t branchfull = {0, 0};
    result_t branchfree = {0, 0};

    size_t st_max = std::min(max, (size_t)std::numeric_limits<T>::max());
    iters = iters * (max / st_max);
    T t_max = (T)st_max;
    if (test_system) {
        using divider_type = T;
        auto dividers = get_primes<divider_type>(t_max);
        sys = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfull) {
        using divider_type = libdivide::divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfull = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfree) {
        using divider_type = libdivide::branchfree_divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfree = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::endl;
    }

    if (test_system && test_branchfull && branchfull.sum != sys.sum) {
        std::cerr << "Error: branchfull_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfull.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system && test_branchfree && branchfree.sum != sys.sum) {
        std::cerr << "Error: branchfree_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfree.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system) std::cout << "    system: " << sys.duration << " seconds" << std::endl;
    if (test_branchfull)
        std::cout << "branchfull: " << branchfull.duration << " seconds" << std::endl;
    if (test_branchfree)
        std::cout << "branchfree: " << branchfree.duration << " seconds" << std::endl;

    std::cout << std::endl;
}